

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

AspifOutput * __thiscall Potassco::AspifOutput::add(AspifOutput *this,WeightLitSpan *lits)

{
  Lit_t LVar1;
  Weight_t WVar2;
  ostream *poVar3;
  size_t sVar4;
  WeightLit_t *pWVar5;
  Span<Potassco::WeightLit_t> *in_RSI;
  AspifOutput *in_RDI;
  WeightLit_t *x;
  WeightLit_t *local_18;
  
  poVar3 = std::operator<<(in_RDI->os_," ");
  sVar4 = size<Potassco::WeightLit_t>(in_RSI);
  std::ostream::operator<<(poVar3,sVar4);
  local_18 = begin<Potassco::WeightLit_t>(in_RSI);
  while( true ) {
    pWVar5 = end<Potassco::WeightLit_t>((Span<Potassco::WeightLit_t> *)0x251407);
    if (local_18 == pWVar5) break;
    poVar3 = std::operator<<(in_RDI->os_," ");
    LVar1 = Potassco::lit(local_18);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,LVar1);
    poVar3 = std::operator<<(poVar3," ");
    WVar2 = weight(local_18);
    std::ostream::operator<<(poVar3,WVar2);
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

AspifOutput& AspifOutput::add(const WeightLitSpan& lits) {
	os_ << " " << size(lits);
	for (const WeightLit_t* x = begin(lits); x != end(lits); ++x) {
		os_ << " " << lit(*x) << " " << weight(*x);
	}
	return *this;
}